

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_module.cpp
# Opt level: O0

void update_shared_ptr(shared_ptr<TestBaseType> *ptr)

{
  shared_ptr<TestDerivedType> local_20;
  shared_ptr<TestBaseType> *local_10;
  shared_ptr<TestBaseType> *ptr_local;
  
  local_10 = ptr;
  std::make_shared<TestDerivedType>();
  std::shared_ptr<TestBaseType>::operator=(local_10,&local_20);
  std::shared_ptr<TestDerivedType>::~shared_ptr(&local_20);
  return;
}

Assistant:

void update_shared_ptr(std::shared_ptr<TestBaseType> &ptr) {
  ptr = std::make_shared<TestDerivedType>();
}